

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.cc
# Opt level: O2

void __thiscall wabt::Token::Destroy(Token *this)

{
  long lStack_20;
  
  if (this->token_type_ - First_Literal < 3) {
    lStack_20 = 0x30;
  }
  else {
    if (4 < this->token_type_ - AlignEqNat) goto LAB_00d9e69b;
    lStack_20 = 0x28;
  }
  std::__cxx11::string::~string((string *)((long)&(this->loc).filename.data_ + lStack_20));
LAB_00d9e69b:
  this->token_type_ = First;
  return;
}

Assistant:

void Token::Destroy() {
  if (HasLiteral()) {
    Destruct(literal_);
  } else if (HasOpcode()) {
    Destruct(opcode_);
  } else if (HasText()) {
    Destruct(text_);
  } else if (HasType()) {
    Destruct(type_);
  }
  token_type_ = TokenType::Invalid;
}